

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tanh_x86.cpp
# Opt level: O0

int __thiscall ncnn::TanH_x86::forward_inplace(TanH_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  long *in_RSI;
  float fVar7;
  int iVar8;
  float fVar10;
  float fVar11;
  undefined1 auVar9 [16];
  float fVar12;
  __m128 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  Mat *m;
  __m128 two;
  __m128 one;
  __m128 one_1;
  v4sf pow2n;
  v4sf y;
  v4sf mask;
  v4sf one_2;
  v4si emm0;
  v4sf fx;
  v4sf tmp;
  undefined8 local_878;
  undefined8 uStack_870;
  int local_860;
  undefined8 local_850;
  undefined8 local_848;
  undefined8 local_840;
  undefined4 local_838;
  long local_830;
  undefined4 local_828;
  undefined4 local_824;
  undefined4 local_820;
  undefined4 local_81c;
  undefined4 local_818;
  undefined8 local_810;
  float *local_808;
  int local_7fc;
  int local_7f8;
  int local_7f4;
  int local_7f0;
  int local_7ec;
  int local_7e8;
  int local_7e4;
  long *local_7d8;
  undefined1 local_7c5;
  int local_7c4;
  undefined8 *local_7b8;
  undefined8 *local_7b0;
  undefined8 *local_7a0;
  float *local_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  float *local_740;
  long local_738;
  undefined4 local_72c;
  long local_728;
  float *local_720;
  undefined4 local_714;
  int local_710;
  int local_70c;
  undefined8 *local_708;
  undefined4 local_6fc;
  long local_6f8;
  undefined8 *local_6d8;
  undefined4 local_6a8;
  undefined4 uStack_6a4;
  undefined4 uStack_6a0;
  undefined4 uStack_69c;
  undefined4 local_68c;
  undefined4 local_688;
  undefined4 uStack_684;
  undefined4 uStack_680;
  undefined4 uStack_67c;
  undefined4 local_66c;
  undefined8 local_668;
  undefined8 uStack_660;
  float local_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined1 local_638 [8];
  float fStack_630;
  float fStack_62c;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  float local_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  undefined4 local_5e8;
  undefined4 uStack_5e4;
  undefined4 uStack_5e0;
  undefined4 uStack_5dc;
  undefined4 local_5cc;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  float local_5a8;
  float fStack_5a4;
  float fStack_5a0;
  float fStack_59c;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  float local_528;
  float fStack_524;
  float fStack_520;
  float fStack_51c;
  float local_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  ulong local_368;
  ulong uStack_360;
  undefined8 *local_350;
  float *local_348;
  float *local_340;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  undefined8 local_328;
  undefined8 uStack_320;
  float local_318 [2];
  float afStack_310 [2];
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 *local_2f0;
  float *local_2e8;
  float *local_2e0;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  float local_2b8 [2];
  float afStack_2b0 [2];
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 *local_290;
  undefined8 *local_288;
  undefined8 *local_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float *local_230;
  undefined8 *local_228;
  undefined8 *local_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  float local_1f8 [2];
  float afStack_1f0 [2];
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float *local_1d0;
  undefined8 *local_1c8;
  undefined8 *local_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  float local_198 [2];
  float afStack_190 [2];
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float *local_170;
  undefined8 *local_168;
  undefined8 *local_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  float local_138 [2];
  float afStack_130 [2];
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float *local_110;
  undefined8 *local_108;
  undefined8 *local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  float local_d8 [2];
  float afStack_d0 [2];
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float *local_b0;
  undefined8 *local_a8;
  undefined8 *local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  float local_78 [2];
  float afStack_70 [2];
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_7e4 = *(int *)((long)in_RSI + 0x2c);
  local_7e8 = (int)in_RSI[6];
  local_7ec = *(int *)((long)in_RSI + 0x34);
  local_7f0 = (int)in_RSI[7];
  local_7f4 = (int)in_RSI[3];
  local_7f8 = local_7e4 * local_7e8 * local_7ec * local_7f4;
  local_7d8 = in_RSI;
  for (local_7fc = 0; local_7fc < local_7f0; local_7fc = local_7fc + 1) {
    local_7b8 = &local_850;
    local_70c = *(int *)((long)local_7d8 + 0x2c);
    local_710 = (int)local_7d8[6];
    local_714 = *(undefined4 *)((long)local_7d8 + 0x34);
    local_720 = (float *)(*local_7d8 + local_7d8[8] * (long)local_7fc * local_7d8[2]);
    local_728 = local_7d8[2];
    local_72c = (undefined4)local_7d8[3];
    local_738 = local_7d8[4];
    local_708 = &local_850;
    local_6f8 = (long)local_70c * (long)local_710 * local_728;
    local_7b0 = &local_850;
    local_7a0 = &local_850;
    local_6fc = 0x10;
    local_7c4 = local_7fc;
    local_7c5 = 1;
    local_850 = 0;
    local_840 = 0;
    local_838 = 0;
    local_828 = 0;
    local_824 = 0;
    local_820 = 0;
    local_81c = 0;
    local_818 = 0;
    local_810 = 0;
    local_848 = 0;
    local_808 = local_720;
    for (local_860 = 0; local_6d8 = local_7a0, local_830 = local_738, local_860 + 3 < local_7f8;
        local_860 = local_860 + 4) {
      local_790 = local_808;
      local_768 = *(undefined8 *)local_808;
      uStack_760 = *(undefined8 *)(local_808 + 2);
      local_66c = 0x3f800000;
      local_688 = 0x3f800000;
      local_778 = 0x3f8000003f800000;
      uStack_770 = 0x3f8000003f800000;
      local_68c = 0x40000000;
      local_6a8 = 0x40000000;
      local_788 = 0x4000000040000000;
      uStack_780 = 0x4000000040000000;
      local_618._0_4_ = (float)local_768;
      local_618._4_4_ = (float)((ulong)local_768 >> 0x20);
      uStack_610._0_4_ = (float)uStack_760;
      uStack_610._4_4_ = (float)((ulong)uStack_760 >> 0x20);
      local_5f8 = (float)local_618 * 2.0;
      fStack_5f4 = local_618._4_4_ * 2.0;
      fStack_5f0 = (float)uStack_610 * 2.0;
      fStack_5ec = uStack_610._4_4_ * 2.0;
      local_5cc = 0x3f800000;
      local_5e8 = 0x3f800000;
      local_608 = 0x3f8000003f800000;
      uStack_600 = 0x3f8000003f800000;
      local_418 = 0;
      uStack_410 = 0;
      local_5b8 = 0;
      uStack_5b0 = 0;
      local_5c8 = CONCAT44(fStack_5f4,local_5f8);
      uStack_5c0 = CONCAT44(fStack_5ec,fStack_5f0);
      local_4f8 = CONCAT44(0.0 - fStack_5f4,0.0 - local_5f8);
      uStack_4f0._0_4_ = 0.0 - fStack_5f0;
      uStack_4f0._4_4_ = 0.0 - fStack_5ec;
      local_428 = 0;
      uStack_420 = 0;
      local_538 = 0x3f8000003f800000;
      uStack_530 = 0x3f8000003f800000;
      local_3f8 = local_4f8;
      uStack_3f0 = uStack_4f0;
      local_408 = 0x42b0c0a542b0c0a5;
      uStack_400 = 0x42b0c0a542b0c0a5;
      auVar5._8_8_ = uStack_4f0;
      auVar5._0_8_ = local_4f8;
      auVar4._8_8_ = 0x42b0c0a542b0c0a5;
      auVar4._0_8_ = 0x42b0c0a542b0c0a5;
      auVar9 = minps(auVar5,auVar4);
      local_4f8 = auVar9._0_8_;
      local_3d8 = local_4f8;
      uStack_4f0 = auVar9._8_8_;
      uStack_3d0 = uStack_4f0;
      local_3e8 = 0xc2b0c0a5c2b0c0a5;
      uStack_3e0 = 0xc2b0c0a5c2b0c0a5;
      auVar6._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar6._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar9 = maxps(auVar9,auVar6);
      local_4f8 = auVar9._0_8_;
      uVar1 = local_4f8;
      uStack_4f0 = auVar9._8_8_;
      uVar2 = uStack_4f0;
      local_488 = 0x3fb8aa3b3fb8aa3b;
      uStack_480 = 0x3fb8aa3b3fb8aa3b;
      local_478._0_4_ = auVar9._0_4_;
      local_478._4_4_ = auVar9._4_4_;
      uStack_470._0_4_ = auVar9._8_4_;
      uStack_470._4_4_ = auVar9._12_4_;
      local_438 = CONCAT44(local_478._4_4_ * 1.442695,(float)local_478 * 1.442695);
      uStack_430 = CONCAT44(uStack_470._4_4_ * 1.442695,(float)uStack_470 * 1.442695);
      local_448 = 0x3f0000003f000000;
      uStack_440 = 0x3f0000003f000000;
      fVar7 = (float)local_478 * 1.442695 + 0.5;
      fVar10 = local_478._4_4_ * 1.442695 + 0.5;
      fVar11 = (float)uStack_470 * 1.442695 + 0.5;
      fVar12 = uStack_470._4_4_ * 1.442695 + 0.5;
      local_3b8 = CONCAT44(fVar10,fVar7);
      uStack_3b0 = CONCAT44(fVar12,fVar11);
      local_3a8 = CONCAT44((int)fVar10,(int)fVar7);
      uStack_3a0 = CONCAT44((int)fVar12,(int)fVar11);
      local_518 = (float)(int)fVar7;
      fStack_514 = (float)(int)fVar10;
      fStack_510 = (float)(int)fVar11;
      fStack_50c = (float)(int)fVar12;
      local_508 = CONCAT44(fStack_514,local_518);
      uStack_500 = CONCAT44(fStack_50c,fStack_510);
      local_388 = local_508;
      uStack_380 = uStack_500;
      local_398 = CONCAT44(fVar10,fVar7);
      uStack_390 = CONCAT44(fVar12,fVar11);
      local_548 = CONCAT44(-(uint)(fVar10 < fStack_514),-(uint)(fVar7 < local_518));
      uStack_540 = CONCAT44(-(uint)(fVar12 < fStack_50c),-(uint)(fVar11 < fStack_510));
      local_368 = local_548;
      uStack_360 = uStack_540;
      local_378 = 0x3f8000003f800000;
      uStack_370 = 0x3f8000003f800000;
      local_548 = local_548 & 0x3f8000003f800000;
      uStack_540 = uStack_540 & 0x3f8000003f800000;
      local_4d8 = local_508;
      uStack_4d0 = uStack_500;
      local_4e8._0_4_ = (float)local_548;
      local_4e8._4_4_ = (float)(local_548 >> 0x20);
      uStack_4e0._0_4_ = (float)uStack_540;
      uStack_4e0._4_4_ = (float)(uStack_540 >> 0x20);
      local_518 = local_518 - (float)local_4e8;
      fStack_514 = fStack_514 - local_4e8._4_4_;
      fStack_510 = fStack_510 - (float)uStack_4e0;
      fStack_50c = fStack_50c - uStack_4e0._4_4_;
      local_340 = &local_518;
      local_2e8 = ::_ps_cephes_exp_C1;
      local_350 = &local_4f8;
      local_2c8 = local_4f8;
      uStack_2c0 = uStack_4f0;
      local_2a8 = CONCAT44(fStack_514,local_518);
      uStack_2a0 = CONCAT44(fStack_50c,fStack_510);
      local_2b8[0] = 0.6933594;
      local_2b8[1] = 0.6933594;
      afStack_2b0[0] = 0.6933594;
      afStack_2b0[1] = 0.6933594;
      local_2d8 = local_518 * 0.6933594;
      fStack_2d4 = fStack_514 * 0.6933594;
      fStack_2d0 = fStack_510 * 0.6933594;
      fStack_2cc = fStack_50c * 0.6933594;
      local_4f8 = CONCAT44(local_478._4_4_ - fStack_2d4,(float)local_478 - local_2d8);
      uStack_4f0._0_4_ = (float)uStack_470 - fStack_2d0;
      uStack_4f0._4_4_ = uStack_470._4_4_ - fStack_2cc;
      local_348 = ::_ps_cephes_exp_C2;
      local_328 = local_4f8;
      uStack_320 = uStack_4f0;
      local_308 = CONCAT44(fStack_514,local_518);
      uStack_300 = CONCAT44(fStack_50c,fStack_510);
      local_318[0] = -0.00021219444;
      local_318[1] = -0.00021219444;
      afStack_310[0] = -0.00021219444;
      afStack_310[1] = -0.00021219444;
      local_338 = local_518 * -0.00021219444;
      fStack_334 = fStack_514 * -0.00021219444;
      fStack_330 = fStack_510 * -0.00021219444;
      fStack_32c = fStack_50c * -0.00021219444;
      fVar7 = ((float)local_478 - local_2d8) - local_338;
      fVar10 = (local_478._4_4_ - fStack_2d4) - fStack_334;
      fVar11 = ((float)uStack_470 - fStack_2d0) - fStack_330;
      fVar12 = (uStack_470._4_4_ - fStack_2cc) - fStack_32c;
      local_4f8 = CONCAT44(fVar10,fVar7);
      uStack_4f0._0_4_ = fVar11;
      uStack_4f0._4_4_ = fVar12;
      local_4a8 = local_4f8;
      uStack_4a0 = uStack_4f0;
      local_508 = CONCAT44(fVar10 * fVar10,fVar7 * fVar7);
      uStack_500 = CONCAT44(fVar12 * fVar12,fVar11 * fVar11);
      local_280 = &local_558;
      local_b0 = ::_ps_cephes_exp_p1;
      local_88 = 0x3950696739506967;
      uStack_80 = 0x3950696739506967;
      local_98 = local_4f8;
      uStack_90 = uStack_4f0;
      local_68 = fVar7 * 0.00019875691;
      fStack_64 = fVar10 * 0.00019875691;
      fStack_60 = fVar11 * 0.00019875691;
      fStack_5c = fVar12 * 0.00019875691;
      local_78[0] = 0.0013981999;
      local_78[1] = 0.0013981999;
      afStack_70[0] = 0.0013981999;
      afStack_70[1] = 0.0013981999;
      local_558 = CONCAT44(fStack_64 + 0.0013981999,local_68 + 0.0013981999);
      uStack_550 = CONCAT44(fStack_5c + 0.0013981999,fStack_60 + 0.0013981999);
      local_110 = ::_ps_cephes_exp_p2;
      local_e8 = local_558;
      uStack_e0 = uStack_550;
      local_f8 = local_4f8;
      uStack_f0 = uStack_4f0;
      local_c8 = (local_68 + 0.0013981999) * fVar7;
      fStack_c4 = (fStack_64 + 0.0013981999) * fVar10;
      fStack_c0 = (fStack_60 + 0.0013981999) * fVar11;
      fStack_bc = (fStack_5c + 0.0013981999) * fVar12;
      local_d8[0] = 0.008333452;
      local_d8[1] = 0.008333452;
      afStack_d0[0] = 0.008333452;
      afStack_d0[1] = 0.008333452;
      local_558 = CONCAT44(fStack_c4 + 0.008333452,local_c8 + 0.008333452);
      uStack_550 = CONCAT44(fStack_bc + 0.008333452,fStack_c0 + 0.008333452);
      local_170 = ::_ps_cephes_exp_p3;
      local_148 = local_558;
      uStack_140 = uStack_550;
      local_158 = local_4f8;
      uStack_150 = uStack_4f0;
      local_128 = (local_c8 + 0.008333452) * fVar7;
      fStack_124 = (fStack_c4 + 0.008333452) * fVar10;
      fStack_120 = (fStack_c0 + 0.008333452) * fVar11;
      fStack_11c = (fStack_bc + 0.008333452) * fVar12;
      local_138[0] = 0.041665796;
      local_138[1] = 0.041665796;
      afStack_130[0] = 0.041665796;
      afStack_130[1] = 0.041665796;
      local_558 = CONCAT44(fStack_124 + 0.041665796,local_128 + 0.041665796);
      uStack_550 = CONCAT44(fStack_11c + 0.041665796,fStack_120 + 0.041665796);
      local_1d0 = ::_ps_cephes_exp_p4;
      local_1a8 = local_558;
      uStack_1a0 = uStack_550;
      local_1b8 = local_4f8;
      uStack_1b0 = uStack_4f0;
      local_188 = (local_128 + 0.041665796) * fVar7;
      fStack_184 = (fStack_124 + 0.041665796) * fVar10;
      fStack_180 = (fStack_120 + 0.041665796) * fVar11;
      fStack_17c = (fStack_11c + 0.041665796) * fVar12;
      local_198[0] = 0.16666666;
      local_198[1] = 0.16666666;
      afStack_190[0] = 0.16666666;
      afStack_190[1] = 0.16666666;
      local_558 = CONCAT44(fStack_184 + 0.16666666,local_188 + 0.16666666);
      uStack_550 = CONCAT44(fStack_17c + 0.16666666,fStack_180 + 0.16666666);
      local_230 = ::_ps_cephes_exp_p5;
      local_208 = local_558;
      uStack_200 = uStack_550;
      local_218 = local_4f8;
      uStack_210 = uStack_4f0;
      local_1e8 = (local_188 + 0.16666666) * fVar7;
      fStack_1e4 = (fStack_184 + 0.16666666) * fVar10;
      fStack_1e0 = (fStack_180 + 0.16666666) * fVar11;
      fStack_1dc = (fStack_17c + 0.16666666) * fVar12;
      local_1f8[0] = 0.5;
      local_1f8[1] = 0.5;
      afStack_1f0[0] = 0.5;
      afStack_1f0[1] = 0.5;
      local_558 = CONCAT44(fStack_1e4 + 0.5,local_1e8 + 0.5);
      uStack_550 = CONCAT44(fStack_1dc + 0.5,fStack_1e0 + 0.5);
      local_288 = &local_508;
      local_268 = local_558;
      uStack_260 = uStack_550;
      local_278 = local_508;
      uStack_270 = uStack_500;
      local_248 = (local_1e8 + 0.5) * fVar7 * fVar7;
      fStack_244 = (fStack_1e4 + 0.5) * fVar10 * fVar10;
      fStack_240 = (fStack_1e0 + 0.5) * fVar11 * fVar11;
      fStack_23c = (fStack_1dc + 0.5) * fVar12 * fVar12;
      local_258 = local_4f8;
      uStack_250 = uStack_4f0;
      local_558 = CONCAT44(fStack_244 + fVar10,local_248 + fVar7);
      uStack_550 = CONCAT44(fStack_23c + fVar12,fStack_240 + fVar11);
      local_458 = local_558;
      uStack_450 = uStack_550;
      local_468 = 0x3f8000003f800000;
      uStack_460 = 0x3f8000003f800000;
      local_5a8 = local_248 + fVar7 + 1.0;
      fStack_5a4 = fStack_244 + fVar10 + 1.0;
      fStack_5a0 = fStack_240 + fVar11 + 1.0;
      fStack_59c = fStack_23c + fVar12 + 1.0;
      local_558 = CONCAT44(fStack_5a4,local_5a8);
      uStack_550 = CONCAT44(fStack_59c,fStack_5a0);
      local_3c8 = CONCAT44(fStack_514,local_518);
      uStack_3c0 = CONCAT44(fStack_50c,fStack_510);
      local_48 = CONCAT44((int)fStack_514,(int)local_518);
      uStack_40 = CONCAT44((int)fStack_50c,(int)fStack_510);
      local_58 = 0x7f0000007f;
      uStack_50 = 0x7f0000007f;
      iVar8 = (int)local_518 + 0x7f;
      fStack_524 = (float)((int)fStack_514 + 0x7f);
      fStack_520 = (float)((int)fStack_510 + 0x7f);
      fStack_51c = (float)((int)fStack_50c + 0x7f);
      local_28 = CONCAT44(fStack_524,iVar8);
      uStack_20 = CONCAT44(fStack_51c,fStack_520);
      local_2c = 0x17;
      local_528 = (float)(iVar8 * 0x800000);
      local_568 = CONCAT44(fStack_524,local_528);
      uStack_560 = CONCAT44(fStack_51c,fStack_520);
      local_4b8 = local_558;
      uStack_4b0 = uStack_550;
      local_5a8 = local_5a8 * local_528;
      fStack_5a4 = fStack_5a4 * fStack_524;
      fStack_5a0 = fStack_5a0 * fStack_520;
      fStack_59c = fStack_59c * fStack_51c;
      local_558 = CONCAT44(fStack_5a4,local_5a8);
      uStack_550 = CONCAT44(fStack_59c,fStack_5a0);
      local_588 = local_558;
      uStack_580 = uStack_550;
      local_5a8 = local_5a8 + 1.0;
      fStack_5a4 = fStack_5a4 + 1.0;
      fStack_5a0 = fStack_5a0 + 1.0;
      fStack_59c = fStack_59c + 1.0;
      auVar3._8_8_ = 0x3f8000003f800000;
      auVar3._0_8_ = 0x3f8000003f800000;
      auVar9._4_4_ = fStack_5a4;
      auVar9._0_4_ = local_5a8;
      auVar9._8_4_ = fStack_5a0;
      auVar9._12_4_ = fStack_59c;
      _local_638 = divps(auVar3,auVar9);
      local_658 = (float)local_638._0_4_ * 2.0;
      fStack_654 = (float)local_638._4_4_ * 2.0;
      fStack_650 = fStack_630 * 2.0;
      fStack_64c = fStack_62c * 2.0;
      local_878 = CONCAT44(fStack_654 - 1.0,local_658 - 1.0);
      uStack_870 = CONCAT44(fStack_64c - 1.0,fStack_650 - 1.0);
      local_740 = local_808;
      local_758 = local_878;
      uStack_750 = uStack_870;
      *local_808 = local_658 - 1.0;
      local_808[1] = fStack_654 - 1.0;
      local_808[2] = fStack_650 - 1.0;
      local_808[3] = fStack_64c - 1.0;
      local_808 = local_808 + 4;
      uStack_6a4 = local_6a8;
      uStack_6a0 = local_6a8;
      uStack_69c = local_6a8;
      uStack_684 = local_688;
      uStack_680 = local_688;
      uStack_67c = local_688;
      local_668 = local_778;
      uStack_660 = uStack_770;
      local_648 = local_788;
      uStack_640 = uStack_780;
      local_628 = local_788;
      uStack_620 = uStack_780;
      local_618 = local_768;
      uStack_610 = uStack_760;
      uStack_5e4 = local_5e8;
      uStack_5e0 = local_5e8;
      uStack_5dc = local_5e8;
      local_598 = local_608;
      uStack_590 = uStack_600;
      local_578 = local_608;
      uStack_570 = uStack_600;
      local_4e8 = local_548;
      uStack_4e0 = uStack_540;
      local_4c8 = local_568;
      uStack_4c0 = uStack_560;
      local_498 = local_4a8;
      uStack_490 = uStack_4a0;
      local_478 = uVar1;
      uStack_470 = uVar2;
      local_2f0 = local_350;
      local_2e0 = local_340;
      local_290 = local_350;
      local_228 = local_350;
      local_220 = local_280;
      local_1c8 = local_350;
      local_1c0 = local_280;
      local_168 = local_350;
      local_160 = local_280;
      local_108 = local_350;
      local_100 = local_280;
      local_a8 = local_350;
      local_a0 = local_280;
      local_18 = local_568;
      uStack_10 = uStack_560;
    }
    for (; local_860 < local_7f8; local_860 = local_860 + 1) {
      fVar7 = tanhf(*local_808);
      *local_808 = fVar7;
      local_808 = local_808 + 1;
    }
  }
  return 0;
}

Assistant:

int TanH_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = tanh_avx512(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = tanh_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = tanh_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = tanhf(*ptr);
            ptr++;
        }
    }

    return 0;
}